

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_compressBegin_usingDict(ZSTD_CCtx *cctx,void *dict,size_t dictSize,int compressionLevel)

{
  size_t sVar1;
  long lVar2;
  ZSTD_CCtx_params *pZVar3;
  undefined8 *puVar4;
  byte bVar5;
  ZSTD_CCtx_params in_stack_fffffffffffffe98;
  ZSTD_parameters local_d0;
  ZSTD_CCtx_params ret;
  
  bVar5 = 0;
  ZSTD_getParams(&local_d0,compressionLevel,0xffffffffffffffff,dictSize);
  memcpy(&ret,&cctx->requestedParams,0x80);
  ret.cParams.windowLog = local_d0.cParams.windowLog;
  ret.cParams.chainLog = local_d0.cParams.chainLog;
  ret.cParams.targetLength = local_d0.cParams.targetLength;
  ret.cParams.strategy = local_d0.cParams.strategy;
  ret.fParams.contentSizeFlag = local_d0.fParams.contentSizeFlag;
  ret.fParams.checksumFlag = local_d0.fParams.checksumFlag;
  ret.fParams.noDictIDFlag = local_d0.fParams.noDictIDFlag;
  ret.compressionLevel = 3;
  pZVar3 = &ret;
  puVar4 = (undefined8 *)&stack0xfffffffffffffe98;
  for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar4 = *(undefined8 *)pZVar3;
    pZVar3 = (ZSTD_CCtx_params *)((long)pZVar3 + (ulong)bVar5 * -0x10 + 8);
    puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
  }
  sVar1 = ZSTD_compressBegin_internal
                    (cctx,dict,dictSize,ZSTD_dct_auto,ZSTD_dtlm_fast,(ZSTD_CDict *)0x0,
                     in_stack_fffffffffffffe98,0xffffffffffffffff,ZSTDb_not_buffered);
  return sVar1;
}

Assistant:

size_t ZSTD_compressBegin_usingDict(ZSTD_CCtx* cctx, const void* dict, size_t dictSize, int compressionLevel)
{
    ZSTD_parameters const params = ZSTD_getParams(compressionLevel, ZSTD_CONTENTSIZE_UNKNOWN, dictSize);
    ZSTD_CCtx_params const cctxParams =
            ZSTD_assignParamsToCCtxParams(cctx->requestedParams, params);
    DEBUGLOG(4, "ZSTD_compressBegin_usingDict (dictSize=%u)", (unsigned)dictSize);
    return ZSTD_compressBegin_internal(cctx, dict, dictSize, ZSTD_dct_auto, ZSTD_dtlm_fast, NULL,
                                       cctxParams, ZSTD_CONTENTSIZE_UNKNOWN, ZSTDb_not_buffered);
}